

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

int yy_params(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar5 = 0;
  yyDo(G,yyPush,2,0,"yyPush");
  iVar3 = yy_param(G);
  if (iVar3 == 0) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
  }
  else {
    yyDo(G,yySet,-2,0,"yySet");
    yyDo(G,yy_1_params,G->begin,G->end,"yy_1_params");
    while( true ) {
      iVar1 = G->pos;
      iVar2 = G->thunkpos;
      do {
        iVar3 = G->pos;
        iVar5 = G->thunkpos;
        iVar4 = yy_ws(G);
      } while (iVar4 != 0);
      G->pos = iVar3;
      G->thunkpos = iVar5;
      iVar3 = yymatchChar(G,0x2c);
      if (iVar3 == 0) break;
      do {
        iVar3 = G->pos;
        iVar5 = G->thunkpos;
        iVar4 = yy_ws(G);
      } while (iVar4 != 0);
      G->pos = iVar3;
      G->thunkpos = iVar5;
      iVar3 = yy_param(G);
      if (iVar3 == 0) break;
      yyDo(G,yySet,-1,0,"yySet");
      yyDo(G,yy_2_params,G->begin,G->end,"yy_2_params");
    }
    G->pos = iVar1;
    G->thunkpos = iVar2;
    yyDo(G,yy_3_params,G->begin,G->end,"yy_3_params");
    yyDo(G,yyPop,2,0,"yyPop");
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

YY_RULE(int) yy_params(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 2, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "params"));
  if (!yy_param(G))  goto l808;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_1_params, G->begin, G->end, "yy_1_params");

  l809:;	
  {  int yypos810= G->pos, yythunkpos810= G->thunkpos;  if (!yy__(G))  goto l810;
  if (!yymatchChar(G, ',')) goto l810;
  if (!yy__(G))  goto l810;
  if (!yy_param(G))  goto l810;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_2_params, G->begin, G->end, "yy_2_params");
  goto l809;
  l810:;	  G->pos= yypos810; G->thunkpos= yythunkpos810;
  }  yyDo(G, yy_3_params, G->begin, G->end, "yy_3_params");
  yyprintf((stderr, "  ok   params"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 2, 0, "yyPop");
  return 1;
  l808:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "params"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}